

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  result rVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  decimal_fp<float> dVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  char cVar14;
  ulong uVar15;
  uint64_t uVar16;
  ulong uVar17;
  uint64_t error;
  uint uVar18;
  size_t __len;
  size_t sVar19;
  decimal_fp<double> dVar20;
  fixed_handler handler;
  int local_74;
  buffer<char> *local_70;
  ulong local_68;
  fixed_handler local_60;
  uint64_t local_48;
  ulong local_40;
  double local_38;
  
  uVar12 = (ulong)specs & 0xff00000000;
  local_60.fixed = uVar12 == 0x200000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar12 != 0x200000000) {
      sVar19 = buf->size_;
      uVar12 = sVar19 + 1;
      if (buf->capacity_ < uVar12) {
        (**buf->_vptr_buffer)(buf);
        sVar19 = buf->size_;
        uVar12 = sVar19 + 1;
      }
      buf->size_ = uVar12;
      buf->ptr_[sVar19] = '0';
      local_74 = 0;
    }
    else {
      uVar6 = (ulong)(uint)precision;
      uVar12 = buf->capacity_;
      if (uVar12 < uVar6) {
        (**buf->_vptr_buffer)(buf,uVar6);
        uVar12 = buf->capacity_;
      }
      if (uVar6 <= uVar12) {
        uVar12 = uVar6;
      }
      buf->size_ = uVar12;
      memset(buf->ptr_,0x30,uVar6);
      local_74 = -precision;
    }
  }
  else {
    local_68 = (ulong)specs >> 0x20;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      iVar3 = snprintf_float<double>(value,precision,specs,buf);
      return iVar3;
    }
    if (precision < 0) {
      if ((specs._4_4_ >> 0x12 & 1) == 0) {
        dVar20 = dragonbox::to_decimal<double>(value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar20.significand);
        local_74 = dVar20.exponent;
      }
      else {
        dVar9 = dragonbox::to_decimal<float>((float)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar9.significand);
        local_74 = dVar9.exponent;
      }
    }
    else {
      uVar6 = (ulong)value & 0xfffffffffffff;
      if (((ulong)value >> 0x34 & 0x7ff) == 0) {
        lVar8 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        lVar7 = uVar6 << (~(byte)lVar8 + 0x35 & 0x3f);
        iVar3 = ((uint)lVar8 ^ 0xffffffc0) - 0x426;
      }
      else {
        iVar3 = ((uint)((ulong)value >> 0x34) & 0x7ff) - 0x433;
        lVar7 = uVar6 + 0x10000000000000;
      }
      iVar5 = (int)((ulong)((long)(-0x32 - iVar3) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar11 = iVar5 + 0x15b;
      uVar18 = iVar5 + 0x162;
      if (-1 < (int)uVar11) {
        uVar18 = uVar11;
      }
      local_40 = (ulong)(uVar18 & 0xfffffff8);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = lVar7 << 0xb;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(basic_data<void>::grisu_pow10_significands +
                               (long)((int)uVar18 >> 3) * 8 + 8);
      uVar6 = SUB168(auVar1 * auVar2,8) - (SUB168(auVar1 * auVar2,0) >> 0x3f);
      bVar10 = -((char)*(undefined2 *)
                        (basic_data<void>::grisu_pow10_exponents + (long)((int)uVar18 >> 3) * 2 + 2)
                + (char)iVar3) - 0x35;
      local_60.precision = 0x2ff;
      if ((uint)precision < 0x2ff) {
        local_60.precision = precision;
      }
      local_60.buf = buf->ptr_;
      local_60.size = 0;
      local_60.exp10 = 0x154 - (uVar18 & 0xfffffff8);
      uVar16 = 1L << (bVar10 & 0x3f);
      uVar13 = uVar6 >> (bVar10 & 0x3f);
      uVar11 = (uint)uVar13 | 1;
      uVar18 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      lVar8 = (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar18 * 2) -
              (ulong)((uint)uVar13 <
                     *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                              (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar18 * 2) * 4));
      local_74 = (int)lVar8;
      local_38 = value;
      rVar4 = fixed_handler::on_start
                        (&local_60,
                         *(long *)("invalid format specifier for char" + lVar8 * 8 + 0x20) <<
                         (bVar10 & 0x3f),uVar6 / 10,10,&local_74);
      if (rVar4 == more) {
        uVar17 = uVar16 - 1;
        uVar6 = uVar6 & uVar17;
        local_70 = buf;
        local_48 = uVar16;
        do {
          iVar3 = local_74 + -1;
          switch(iVar3) {
          case 0:
            cVar14 = (char)uVar13;
            uVar13 = 0;
            goto LAB_0018dfff;
          case 1:
            cVar14 = (char)((uVar13 & 0xffffffff) / 10);
            iVar5 = (int)((uVar13 & 0xffffffff) / 10) * 10;
            break;
          case 2:
            cVar14 = (char)((uVar13 & 0xffffffff) / 100);
            iVar5 = (int)((uVar13 & 0xffffffff) / 100) * 100;
            break;
          case 3:
            cVar14 = (char)((uVar13 & 0xffffffff) / 1000);
            iVar5 = (int)((uVar13 & 0xffffffff) / 1000) * 1000;
            break;
          case 4:
            cVar14 = (char)((uVar13 & 0xffffffff) / 10000);
            iVar5 = (int)((uVar13 & 0xffffffff) / 10000) * 10000;
            break;
          case 5:
            uVar15 = uVar13 >> 5 & 0x7ffffff;
            cVar14 = (char)(uVar15 / 0xc35);
            iVar5 = (int)(uVar15 / 0xc35) * 100000;
            break;
          case 6:
            cVar14 = (char)((uVar13 & 0xffffffff) / 1000000);
            iVar5 = (int)((uVar13 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 7:
            cVar14 = (char)((uVar13 & 0xffffffff) / 10000000);
            iVar5 = (int)((uVar13 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 8:
            cVar14 = (char)((uVar13 & 0xffffffff) / 100000000);
            iVar5 = (int)((uVar13 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 9:
            uVar15 = (uVar13 >> 9 & 0x7fffff) * 0x44b83;
            cVar14 = (char)(uVar15 >> 0x27);
            iVar5 = (uint)(uVar15 >> 0x27) * 1000000000;
            break;
          default:
            cVar14 = '\0';
            goto LAB_0018dfff;
          }
          uVar13 = (ulong)(uint)((int)uVar13 - iVar5);
LAB_0018dfff:
          lVar8 = (long)local_74;
          local_74 = iVar3;
          rVar4 = fixed_handler::on_digit
                            (&local_60,cVar14 + '0',
                             *(long *)("invalid format specifier for char" + lVar8 * 8 + 0x20) <<
                             (bVar10 & 0x3f),((uVar13 & 0xffffffff) << (bVar10 & 0x3f)) + uVar6,1,
                             iVar3,true);
          uVar16 = local_48;
          buf = local_70;
          if (rVar4 != more) goto LAB_0018e0b0;
        } while (0 < local_74);
        error = 1;
        do {
          uVar13 = uVar6 * 10;
          error = error * 10;
          uVar6 = uVar13 & uVar17;
          local_74 = local_74 + -1;
          rVar4 = fixed_handler::on_digit
                            (&local_60,(char)(uVar13 >> (bVar10 & 0x3f)) + '0',uVar16,uVar6,error,
                             local_74,false);
          buf = local_70;
        } while (rVar4 == more);
      }
LAB_0018e0b0:
      if (rVar4 == error) {
        local_74 = (local_60.size - ((int)local_40 + 8)) + local_74 + 0x15b;
        uVar18 = (uint)local_68;
        fallback_format<double>
                  (local_38,local_60.precision,(bool)((byte)(local_68 >> 0x12) & 1),buf,&local_74);
      }
      else {
        local_74 = local_74 + local_60.exp10;
        uVar13 = (ulong)(uint)local_60.size;
        uVar6 = buf->capacity_;
        if (uVar6 < uVar13) {
          (**buf->_vptr_buffer)(buf,uVar13);
          uVar6 = buf->capacity_;
        }
        if (uVar6 < uVar13) {
          uVar13 = uVar6;
        }
        buf->size_ = uVar13;
        uVar18 = (uint)local_68;
      }
      if ((uVar18 >> 0x14 & 1) == 0 && uVar12 != 0x200000000) {
        sVar19 = buf->size_;
        if (sVar19 != 0) {
          do {
            iVar3 = local_74 + 1;
            if (buf->ptr_[sVar19 - 1] != '0') {
              uVar12 = buf->capacity_;
              if (uVar12 < sVar19) {
                (**buf->_vptr_buffer)(buf,sVar19);
                uVar12 = buf->capacity_;
              }
              goto LAB_0018e17a;
            }
            sVar19 = sVar19 - 1;
            local_74 = iVar3;
          } while (sVar19 != 0);
        }
        uVar12 = buf->capacity_;
        sVar19 = 0;
LAB_0018e17a:
        if (uVar12 < sVar19) {
          sVar19 = uVar12;
        }
        buf->size_ = sVar19;
      }
    }
  }
  return local_74;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}